

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

int __thiscall deqp::gles31::bb::BufferLayout::getVariableIndex(BufferLayout *this,string *name)

{
  pointer pBVar1;
  __type _Var2;
  int ndx;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  lVar3 = 0;
  while( true ) {
    pBVar1 = (this->bufferVars).
             super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->bufferVars).
                     super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x48) <= lVar3) {
      return -1;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pBVar1->name)._M_dataplus._M_p + lVar4),name);
    if (_Var2) break;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x48;
  }
  return (int)lVar3;
}

Assistant:

int BufferLayout::getVariableIndex (const string& name) const
{
	for (int ndx = 0; ndx < (int)bufferVars.size(); ndx++)
	{
		if (bufferVars[ndx].name == name)
			return ndx;
	}
	return -1;
}